

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int find_column(ParseData *lParse,char *colName,void *itslval)

{
  int iVar1;
  int local_e4;
  iteratorCol *piStack_e0;
  int i;
  iteratorCol *colIter;
  DataInfo *varInfo;
  double dStack_c8;
  int istatus;
  double tscale;
  double tzero;
  char temp [80];
  fitsfile *local_60;
  fitsfile *fptr;
  long width;
  long repeat;
  uint local_40;
  int type;
  int typecode;
  int colnum;
  int status;
  int col_cnt;
  FITS_PARSER_YYSTYPE *thelval;
  void *itslval_local;
  char *colName_local;
  ParseData *lParse_local;
  
  _status = (long *)itslval;
  thelval = (FITS_PARSER_YYSTYPE *)itslval;
  itslval_local = colName;
  colName_local = (char *)lParse;
  if (DEBUG_PIXFILTER != 0) {
    printf("find_column(%s)\n");
  }
  if (*itslval_local == '#') {
    iVar1 = find_keywd((ParseData *)colName_local,(char *)((long)itslval_local + 1),thelval);
    return iVar1;
  }
  local_60 = *(fitsfile **)colName_local;
  typecode = 0;
  colnum = *(int *)(colName_local + 0x60);
  if (*(int *)(colName_local + 0xdc) == 0) {
    if (*(long *)(colName_local + 0xb0) == 0) {
      colName_local[0xe0] = -0x25;
      colName_local[0xe1] = '\0';
      colName_local[0xe2] = '\0';
      colName_local[0xe3] = '\0';
      ffpmsg("find_column: IMAGE_HDU but no PixelFilter");
      return -1;
    }
    type = -1;
    for (local_e4 = 0; local_e4 < **(int **)(colName_local + 0xb0); local_e4 = local_e4 + 1) {
      iVar1 = fits_strcasecmp((char *)itslval_local,
                              *(char **)(*(long *)(*(long *)(colName_local + 0xb0) + 0x10) +
                                        (long)local_e4 * 8));
      if (iVar1 == 0) {
        type = local_e4;
      }
    }
    if (type < 0) {
      snprintf((char *)&tzero,0x50,"find_column: PixelFilter tag %s not found",itslval_local);
      ffpmsg((char *)&tzero);
      colName_local[0xe0] = -0x25;
      colName_local[0xe1] = '\0';
      colName_local[0xe2] = '\0';
      colName_local[0xe3] = '\0';
      return -1;
    }
    iVar1 = fits_parser_allocateCol((ParseData *)colName_local,colnum,(int *)(colName_local + 0xe0))
    ;
    if (iVar1 != 0) {
      return -1;
    }
    colIter = (iteratorCol *)(*(long *)(colName_local + 0xa8) + (long)colnum * 0xa0);
    piStack_e0 = (iteratorCol *)(*(long *)(colName_local + 0xa0) + (long)colnum * 0x110);
    local_60 = *(fitsfile **)(*(long *)(*(long *)(colName_local + 0xb0) + 0x18) + (long)type * 8);
    ffgipr(local_60,5,(int *)&local_40,(int *)&colIter->array,&colIter->repeat,&typecode);
    *(long *)&colIter->iotype = 1;
    repeat._4_4_ = 0x10e;
    iVar1 = set_image_col_types((ParseData *)colName_local,local_60,(char *)itslval_local,local_40,
                                (DataInfo *)colIter,piStack_e0);
    if (iVar1 != 0) {
      return -1;
    }
    piStack_e0->fptr = local_60;
    piStack_e0->iotype = 0;
  }
  else {
    if (*(int *)(colName_local + 0x18) == 0) {
      iVar1 = ffgcno(local_60,0,(char *)itslval_local,&type,&typecode);
      if (iVar1 != 0) {
        if (typecode == 0xdb) {
          repeat._4_4_ = find_keywd((ParseData *)colName_local,(char *)itslval_local,thelval);
          if (repeat._4_4_ != -1) {
            ffcmsg();
          }
          return repeat._4_4_;
        }
        *(int *)(colName_local + 0xe0) = typecode;
        return -1;
      }
    }
    else {
      type = *(int *)(colName_local + 0x24);
    }
    iVar1 = ffgtcl(local_60,type,(int *)&local_40,&width,(long *)&fptr,&typecode);
    if (iVar1 != 0) {
      *(int *)(colName_local + 0xe0) = typecode;
      return -1;
    }
    iVar1 = fits_parser_allocateCol((ParseData *)colName_local,colnum,(int *)(colName_local + 0xe0))
    ;
    if (iVar1 != 0) {
      return -1;
    }
    colIter = (iteratorCol *)(*(long *)(colName_local + 0xa8) + (long)colnum * 0xa0);
    piStack_e0 = (iteratorCol *)(*(long *)(colName_local + 0xa0) + (long)colnum * 0x110);
    fits_iter_set_by_num(piStack_e0,local_60,type,0,0);
  }
  strncpy((char *)colIter,(char *)itslval_local,0x50);
  colIter->colname[0x44] = '\0';
  if (*(int *)(colName_local + 0xdc) != 0) {
    switch(local_40) {
    case 1:
      colIter->datatype = 0x106;
      piStack_e0->datatype = 0xb;
      repeat._4_4_ = 0x111;
      break;
    default:
      if ((int)local_40 < 0) {
        snprintf((char *)&tzero,0x50,
                 "variable-length array columns are not supported. typecode = %d",(ulong)local_40);
        ffpmsg((char *)&tzero);
      }
      colName_local[0xe0] = -0x50;
      colName_local[0xe1] = '\x01';
      colName_local[0xe2] = '\0';
      colName_local[0xe3] = '\0';
      return -1;
    case 0xb:
    case 0x15:
    case 0x29:
      snprintf((char *)&tzero,0x50,"TZERO%d",(ulong)(uint)type);
      varInfo._4_4_ = 0;
      iVar1 = ffgky(local_60,0x52,(char *)&tzero,&tscale,(char *)0x0,(int *)((long)&varInfo + 4));
      if (iVar1 != 0) {
        tscale = 0.0;
      }
      snprintf((char *)&tzero,0x50,"TSCAL%d",(ulong)(uint)type);
      varInfo._4_4_ = 0;
      iVar1 = ffgky(local_60,0x52,(char *)&tzero,&stack0xffffffffffffff38,(char *)0x0,
                    (int *)((long)&varInfo + 4));
      if (iVar1 != 0) {
        dStack_c8 = 1.0;
      }
      if (((dStack_c8 != 1.0) || (NAN(dStack_c8))) ||
         (((tscale != 0.0 || (NAN(tscale))) && ((tscale != 32768.0 || (NAN(tscale))))))) {
        colIter->datatype = 0x104;
        piStack_e0->datatype = 0x52;
      }
      else {
        colIter->datatype = 0x103;
        piStack_e0->datatype = 0x29;
      }
      repeat._4_4_ = 0x10e;
      break;
    case 0xe:
      colIter->datatype = 0x102;
      piStack_e0->datatype = 0xe;
      repeat._4_4_ = 0x10f;
      break;
    case 0x10:
      colIter->datatype = 0x105;
      piStack_e0->datatype = 0x10;
      repeat._4_4_ = 0x110;
      if (0xff < (long)fptr) {
        snprintf((char *)&tzero,0x50,"column %d is wider than maximum %d characters",
                 (ulong)(uint)type,0xff);
        ffpmsg((char *)&tzero);
        colName_local[0xe0] = -0x4f;
        colName_local[0xe1] = '\x01';
        colName_local[0xe2] = '\0';
        colName_local[0xe3] = '\0';
        return -1;
      }
      if (*(int *)(colName_local + 0xdc) == 1) {
        width = (long)fptr;
      }
      break;
    case 0x2a:
    case 0x51:
    case 0x52:
      colIter->datatype = 0x104;
      piStack_e0->datatype = 0x52;
      repeat._4_4_ = 0x10e;
    }
    *(long *)&colIter->iotype = width;
    piStack_e0->repeat = 0;
    if ((width < 2) || (local_40 == 0x10)) {
      *(undefined4 *)&colIter->array = 1;
      colIter->repeat = 1;
    }
    else {
      iVar1 = ffgtdm(local_60,type,5,(int *)&colIter->array,&colIter->repeat,&typecode);
      if (iVar1 != 0) {
        *(int *)(colName_local + 0xe0) = typecode;
        return -1;
      }
    }
  }
  *(int *)(colName_local + 0x60) = *(int *)(colName_local + 0x60) + 1;
  *_status = (long)colnum;
  return repeat._4_4_;
}

Assistant:

static int find_column( ParseData *lParse, char *colName, void *itslval )
{
   FITS_PARSER_YYSTYPE *thelval = (FITS_PARSER_YYSTYPE*)itslval;
   int col_cnt, status;
   int colnum, typecode, type;
   long repeat, width;
   fitsfile *fptr;
   char temp[80];
   double tzero,tscale;
   int istatus;
   DataInfo *varInfo;
   iteratorCol *colIter;

if (DEBUG_PIXFILTER)
   printf("find_column(%s)\n", colName);

   if( *colName == '#' )
     return( find_keywd( lParse, colName + 1, itslval ) );

   fptr = lParse->def_fptr;

   status = 0;
   col_cnt = lParse->nCols;

if (lParse->hdutype == IMAGE_HDU) {
   int i;
   if (!lParse->pixFilter) {
      lParse->status = COL_NOT_FOUND;
      ffpmsg("find_column: IMAGE_HDU but no PixelFilter");
      return pERROR;
   }

   colnum = -1;
   for (i = 0; i < lParse->pixFilter->count; ++i) {
      if (!fits_strcasecmp(colName, lParse->pixFilter->tag[i]))
         colnum = i;
   }
   if (colnum < 0) {
      snprintf(temp, 80, "find_column: PixelFilter tag %s not found", colName);
      ffpmsg(temp);
      lParse->status = COL_NOT_FOUND;
      return pERROR;
   }

   if( fits_parser_allocateCol( lParse, col_cnt, &lParse->status ) ) return pERROR;

   varInfo = lParse->varData + col_cnt;
   colIter = lParse->colData + col_cnt;

   fptr = lParse->pixFilter->ifptr[colnum];
   fits_get_img_param(fptr,
                MAXDIMS,
                &typecode, /* actually bitpix */
                &varInfo->naxis,
                &varInfo->naxes[0],
                &status);
   varInfo->nelem = 1;
   type = COLUMN;
   if (set_image_col_types(lParse, fptr, colName, typecode, varInfo, colIter))
      return pERROR;
   colIter->fptr = fptr;
   colIter->iotype = InputCol;
}
else { /* HDU holds a table */
   if( lParse->compressed )
      colnum = lParse->valCol;
   else
      if( fits_get_colnum( fptr, CASEINSEN, colName, &colnum, &status ) ) {
         if( status == COL_NOT_FOUND ) {
	   type = find_keywd( lParse, colName, itslval );
            if( type != pERROR ) ffcmsg();
            return( type );
         }
         lParse->status = status;
         return pERROR;
      }
   
   if( fits_get_coltype( fptr, colnum, &typecode,
                         &repeat, &width, &status ) ) {
      lParse->status = status;
      return pERROR;
   }

   if( fits_parser_allocateCol( lParse, col_cnt, &lParse->status ) ) return pERROR;

   varInfo = lParse->varData + col_cnt;
   colIter = lParse->colData + col_cnt;

   fits_iter_set_by_num( colIter, fptr, colnum, 0, InputCol );
}

   /*  Make sure we don't overflow variable name array  */
   strncpy(varInfo->name,colName,MAXVARNAME);
   varInfo->name[MAXVARNAME] = '\0';

if (lParse->hdutype != IMAGE_HDU) {
   switch( typecode ) {
   case TBIT:
      varInfo->type     = BITSTR;
      colIter->datatype = TBYTE;
      type = BITCOL;
      break;
   case TBYTE:
   case TSHORT:
   case TLONG:
      /* The datatype of column with TZERO and TSCALE keywords might be 
         float or double. 
      */
      snprintf(temp,80,"TZERO%d",colnum);
      istatus = 0;
      if(fits_read_key(fptr,TDOUBLE,temp,&tzero,NULL,&istatus)) {
          tzero = 0.0;
      } 
      snprintf(temp,80,"TSCAL%d",colnum);
      istatus = 0;
      if(fits_read_key(fptr,TDOUBLE,temp,&tscale,NULL,&istatus)) {
          tscale = 1.0;
      } 
      if (tscale == 1.0 && (tzero == 0.0 || tzero == 32768.0 )) {
          varInfo->type     = LONG;
          colIter->datatype = TLONG;
/*    Reading an unsigned long column as a long can cause overflow errors.
      Treat the column as a double instead.
      } else if (tscale == 1.0 &&  tzero == 2147483648.0 ) {
          varInfo->type     = LONG;
          colIter->datatype = TULONG;
 */

      }
      else {
          varInfo->type     = DOUBLE;
          colIter->datatype = TDOUBLE;
      }
      type = COLUMN;
      break;
/* 
  For now, treat 8-byte integer columns as type double.
  This can lose precision, so the better long term solution
  will be to add support for TLONGLONG as a separate datatype.
*/
   case TLONGLONG:
   case TFLOAT:
   case TDOUBLE:
      varInfo->type     = DOUBLE;
      colIter->datatype = TDOUBLE;
      type = COLUMN;
      break;
   case TLOGICAL:
      varInfo->type     = BOOLEAN;
      colIter->datatype = TLOGICAL;
      type = BCOLUMN;
      break;
   case TSTRING:
      varInfo->type     = STRING;
      colIter->datatype = TSTRING;
      type = SCOLUMN;
      if ( width >= MAX_STRLEN ) {
	snprintf(temp, 80, "column %d is wider than maximum %d characters",
		colnum, MAX_STRLEN-1);
        ffpmsg(temp);
	lParse->status = PARSE_LRG_VECTOR;
	return pERROR;
      }
      if( lParse->hdutype == ASCII_TBL ) repeat = width;
      break;
   default:
      if (typecode < 0) {
        snprintf(temp, 80,"variable-length array columns are not supported. typecode = %d", typecode);
        ffpmsg(temp);
      }
      lParse->status = PARSE_BAD_TYPE;
      return pERROR;
   }
   varInfo->nelem = repeat;
   colIter->repeat = 0; /* ffiter() will fill in this value */
   if( repeat>1 && typecode!=TSTRING ) {
      if( fits_read_tdim( fptr, colnum, MAXDIMS,
                          &varInfo->naxis,
                          &varInfo->naxes[0], &status )
          ) {
         lParse->status = status;
         return pERROR;
      }
   } else {
      varInfo->naxis = 1;
      varInfo->naxes[0] = 1;
   }
}
   lParse->nCols++;
   thelval->lng = col_cnt;

   return( type );
}